

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O3

Value __thiscall toml::internal::Parser::parse(Parser *this)

{
  TokenType TVar1;
  Value *pVVar2;
  bool bVar3;
  Value *current;
  anon_union_8_8_51f126cb_for_Value_2 extraout_RDX;
  Parser *in_RSI;
  Value VVar4;
  Value local_68;
  undefined1 local_58 [32];
  _Base_ptr local_38;
  size_t local_30;
  
  current = &local_68;
  local_58._24_8_ = local_58 + 8;
  local_58._16_8_ = (_Base_ptr)0x0;
  local_58._0_8_ = (pointer)0x0;
  local_58._8_8_ = 0;
  local_30 = 0;
  local_68.type_ = TABLE_TYPE;
  local_38 = (_Base_ptr)local_58._24_8_;
  local_68.field_1.null_ = operator_new(0x30);
  pVVar2 = &local_68;
  ((local_68.field_1.array_)->super__Vector_base<toml::Value,_std::allocator<toml::Value>_>)._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(size_type **)((long)&(local_68.field_1.string_)->field_2 + 8) =
       &(local_68.field_1.string_)->_M_string_length;
  ((local_68.field_1.table_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)&(local_68.field_1.string_)->_M_string_length;
  ((local_68.field_1.table_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined4 *)&(local_68.field_1.string_)->_M_string_length = 0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
               *)local_58);
  while( true ) {
    while (TVar1 = (in_RSI->token_).type_, TVar1 == END_OF_LINE) {
      nextKey(in_RSI);
    }
    if (TVar1 == END_OF_FILE) break;
    if (TVar1 == LBRACKET) {
      current = parseGroupKey(in_RSI,&local_68);
      if (current == (Value *)0x0) {
        local_58._0_8_ = local_58 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_58,"error when parsing group key","");
        addError(in_RSI,(string *)local_58);
LAB_00132737:
        if ((undefined1 *)local_58._0_8_ != local_58 + 0x10) {
          operator_delete((void *)local_58._0_8_,(ulong)(local_58._16_8_ + 1));
        }
        *(undefined4 *)&(this->lexer_).is_ = 0;
        pVVar2 = (Value *)&this->lexer_;
LAB_0013275b:
        (pVVar2->field_1).null_ = (void *)0x0;
        Value::~Value(&local_68);
        VVar4.field_1.null_ = extraout_RDX.null_;
        VVar4._0_8_ = this;
        return VVar4;
      }
    }
    else {
      bVar3 = parseKeyValue(in_RSI,current);
      if (!bVar3) {
        local_58._0_8_ = local_58 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_58,"error when parsing key Value","");
        addError(in_RSI,(string *)local_58);
        goto LAB_00132737;
      }
    }
  }
  *(Type *)&(this->lexer_).is_ = local_68.type_;
  switch(local_68.type_) {
  case NULL_TYPE:
  case INT_TYPE:
  case STRING_TYPE:
  case TIME_TYPE:
  case ARRAY_TYPE:
  case TABLE_TYPE:
    *(anon_union_8_8_51f126cb_for_Value_2 *)&(this->lexer_).lineNo_ = (Table *)local_68.field_1;
    break;
  case BOOL_TYPE:
    *(bool *)&(this->lexer_).lineNo_ = local_68.field_1.bool_;
    break;
  case DOUBLE_TYPE:
    *(anon_union_8_8_51f126cb_for_Value_2 *)&(this->lexer_).lineNo_ = (Table *)local_68.field_1;
    break;
  default:
    *(undefined4 *)&(this->lexer_).is_ = 0;
    *(undefined8 *)&(this->lexer_).lineNo_ = 0;
  }
  local_68.type_ = NULL_TYPE;
  goto LAB_0013275b;
}

Assistant:

inline Value Parser::parse()
{
    Value root((Table()));
    Value* currentValue = &root;

    while (true) {
        skipForKey();
        if (token().type() == TokenType::END_OF_FILE)
            break;
        if (token().type() == TokenType::LBRACKET) {
            currentValue = parseGroupKey(&root);
            if (!currentValue) {
                addError("error when parsing group key");
                return Value();
            }
            continue;
        }

        if (!parseKeyValue(currentValue)) {
            addError("error when parsing key Value");
            return Value();
        }
    }
    return root;
}